

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall
gimage::BasicImageIO::load
          (BasicImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  IOException *this_00;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_78,name,&local_79);
  std::operator+(&local_58,"Loading this image type is not implemented! (",&local_78);
  std::operator+(&local_38,&local_58,")");
  gutil::IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void BasicImageIO::load(ImageU8 &image, const char *name, int ds, long x,
                        long y, long w, long h) const
{
  throw gutil::IOException("Loading this image type is not implemented! ("+std::string(name)+")");
}